

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O2

void __thiscall
ipx::SplittedNormalMatrix::_Apply
          (SplittedNormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  Vector *this_00;
  int *piVar1;
  double *pdVar2;
  int *piVar3;
  double dVar4;
  Timer timer;
  double local_40;
  Timer local_38;
  
  Timer::Timer(&local_38);
  this_00 = &this->work_;
  std::valarray<double>::operator=(this_00,rhs);
  Timer::Reset(&local_38);
  BackwardSolve(&this->L_,&this->U_,this_00);
  dVar4 = Timer::Elapsed(&local_38);
  this->time_Bt_ = dVar4 + this->time_Bt_;
  local_40 = 0.0;
  std::valarray<double>::operator=(lhs,&local_40);
  Timer::Reset(&local_38);
  AddNormalProduct(&this->N_,(double *)0x0,this_00,lhs);
  dVar4 = Timer::Elapsed(&local_38);
  this->time_NNt_ = dVar4 + this->time_NNt_;
  Timer::Reset(&local_38);
  ForwardSolve(&this->L_,&this->U_,lhs);
  dVar4 = Timer::Elapsed(&local_38);
  this->time_B_ = dVar4 + this->time_B_;
  std::valarray<double>::operator+=(lhs,rhs);
  piVar1 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = lhs->_M_data;
  for (piVar3 = (this->free_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    pdVar2[*piVar3] = 0.0;
  }
  if (rhs_dot_lhs != (double *)0x0) {
    dVar4 = Dot(rhs,lhs);
    *rhs_dot_lhs = dVar4;
  }
  return;
}

Assistant:

void SplittedNormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                                  double* rhs_dot_lhs) {
    assert(prepared_);
    Timer timer;

    // Compute work = inverse(B') * rhs.
    work_ = rhs;
    timer.Reset();
    BackwardSolve(L_, U_, work_);
    time_Bt_ += timer.Elapsed();

    // Compute lhs = N*N' * work.
    lhs = 0.0;
    timer.Reset();
    AddNormalProduct(N_, nullptr, work_, lhs);
    time_NNt_ += timer.Elapsed();

    // Compute lhs := inverse(B) * lhs.
    timer.Reset();
    ForwardSolve(L_, U_, lhs);
    time_B_ += timer.Elapsed();

    lhs += rhs;
    for (Int i : free_positions_)
        lhs[i] = 0.0;
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
}